

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImTriangleBarycentricCoords
               (ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *p,float *out_u,float *out_v,float *out_w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar6 = a->x;
  fVar2 = a->y;
  fVar1 = b->x - fVar6;
  fVar3 = b->y - fVar2;
  fVar5 = c->x - fVar6;
  fVar4 = c->y - fVar2;
  fVar6 = p->x - fVar6;
  fVar2 = p->y - fVar2;
  fVar7 = fVar1 * fVar4 - fVar3 * fVar5;
  *out_v = (fVar4 * fVar6 - fVar5 * fVar2) / fVar7;
  fVar7 = (fVar2 * fVar1 - fVar6 * fVar3) / fVar7;
  *out_w = fVar7;
  *out_u = (1.0 - *out_v) - fVar7;
  return;
}

Assistant:

void ImTriangleBarycentricCoords(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& p, float& out_u, float& out_v, float& out_w)
{
    ImVec2 v0 = b - a;
    ImVec2 v1 = c - a;
    ImVec2 v2 = p - a;
    const float denom = v0.x * v1.y - v1.x * v0.y;
    out_v = (v2.x * v1.y - v1.x * v2.y) / denom;
    out_w = (v0.x * v2.y - v2.x * v0.y) / denom;
    out_u = 1.0f - out_v - out_w;
}